

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>::
emplace<QStyleSheetStyleCaches::Tampered<QFont>const&>
          (QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>> *this,QWidget **key,
          Tampered<QFont> *args)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  Tampered<QFont> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 == (Data *)0x0) {
    local_40._0_8_ = (Data *)0x0;
LAB_003653cc:
    QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>::detach
              ((QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *)this);
    pVar2 = (piter)emplace_helper<QStyleSheetStyleCaches::Tampered<QFont>const&>(this,key,args);
    QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>::~QHash
              ((QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *)&local_40);
  }
  else {
    if (1 < *(uint *)&pDVar1->ref) {
      local_40._0_8_ = pDVar1;
      if (*(uint *)&pDVar1->ref != 0xffffffff) {
        LOCK();
        pDVar1->ref = (RefCount)(*(uint *)&pDVar1->ref + 1);
        UNLOCK();
      }
      goto LAB_003653cc;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar2 = (piter)emplace_helper<QStyleSheetStyleCaches::Tampered<QFont>const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_00365442;
    }
    QStyleSheetStyleCaches::Tampered<QFont>::Tampered(&local_40,args);
    pVar2 = (piter)emplace_helper<QStyleSheetStyleCaches::Tampered<QFont>>(this,key,&local_40);
    QFont::~QFont(&local_40.oldWidgetValue);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar2;
  }
LAB_00365442:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }